

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcCovering::IfcCovering(IfcCovering *this)

{
  *(undefined ***)&this->field_0x180 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x188 = 0;
  *(char **)&this->field_0x190 = "IfcCovering";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__007a3788);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x7a3658;
  *(undefined8 *)&this->field_0x180 = 0x7a3770;
  *(undefined8 *)&this->field_0x88 = 0x7a3680;
  *(undefined8 *)&this->field_0x98 = 0x7a36a8;
  *(undefined8 *)&this->field_0xd0 = 0x7a36d0;
  *(undefined8 *)&this->field_0x100 = 0x7a36f8;
  *(undefined8 *)&this->field_0x138 = 0x7a3720;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x7a3748;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x10
       = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x18 =
       0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x20 = 0;
  this->field_0x178 = 0;
  return;
}

Assistant:

IfcCovering() : Object("IfcCovering") {}